

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::isSignExted(OptimizeInstructions *this,Expression *curr,Index bits)

{
  Index IVar1;
  Expression *pEVar2;
  LocalGet *pLVar3;
  reference pvVar4;
  LocalGet *get;
  Index bits_local;
  Expression *curr_local;
  OptimizeInstructions *this_local;
  
  pEVar2 = Properties::getSignExtValue(curr);
  if (pEVar2 == (Expression *)0x0) {
    pLVar3 = Expression::dynCast<wasm::LocalGet>(curr);
    if (pLVar3 == (LocalGet *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pvVar4 = std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::operator[]
                         (&this->localInfo,(ulong)pLVar3->index);
      this_local._7_1_ = pvVar4->signExtedBits == bits;
    }
  }
  else {
    IVar1 = Properties::getSignExtBits(curr);
    this_local._7_1_ = IVar1 == bits;
  }
  return this_local._7_1_;
}

Assistant:

bool isSignExted(Expression* curr, Index bits) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr) == bits;
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // check what we know about the local
      return localInfo[get->index].signExtedBits == bits;
    }
    return false;
  }